

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O0

void __thiscall FDDSTexture::ReadRGB(FDDSTexture *this,FWadLump *lump,BYTE *tcbuf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  BYTE *pBVar8;
  byte *local_80;
  uint local_74;
  DWORD a;
  DWORD b_1;
  DWORD g_1;
  DWORD r_1;
  DWORD b;
  DWORD g;
  DWORD r;
  DWORD c;
  BYTE *pixelp;
  BYTE *buffp;
  BYTE *linebuff;
  uint local_28;
  DWORD amask;
  DWORD y;
  DWORD x;
  BYTE *tcbuf_local;
  FWadLump *lump_local;
  FDDSTexture *this_local;
  
  if (this->AMask == 0) {
    local_74 = 0;
  }
  else {
    local_74 = 0x80000000 >> (this->AShiftL & 0x1f);
  }
  pBVar8 = (BYTE *)operator_new__((long)this->Pitch);
  for (local_28 = (uint)(this->super_FTexture).Height; local_28 != 0; local_28 = local_28 - 1) {
    if (tcbuf == (BYTE *)0x0) {
      local_80 = this->Pixels + local_28;
    }
    else {
      local_80 = tcbuf + local_28 * 4 * (uint)(this->super_FTexture).Height;
    }
    _r = local_80;
    (*(lump->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
              (lump,pBVar8,(long)this->Pitch);
    pixelp = pBVar8;
    for (amask = (DWORD)(this->super_FTexture).Width; amask != 0; amask = amask - 1) {
      if (this->Format == 4) {
        g = *(DWORD *)pixelp;
        pixelp = pixelp + 4;
      }
      else if (this->Format == 2) {
        g = (DWORD)*(ushort *)pixelp;
        pixelp = pixelp + 2;
      }
      else if (this->Format == 3) {
        g = (DWORD)*(uint3 *)pixelp;
        pixelp = pixelp + 3;
      }
      else {
        g = (DWORD)*pixelp;
        pixelp = pixelp + 1;
      }
      if (tcbuf == (BYTE *)0x0) {
        if ((local_74 == 0) || ((g & local_74) != 0)) {
          uVar4 = (g & this->RMask) << (this->RShiftL & 0x1f);
          uVar5 = (g & this->GMask) << (this->GShiftL & 0x1f);
          uVar6 = (g & this->BMask) << (this->BShiftL & 0x1f);
          *_r = RGB32k.All
                [(ulong)((uVar6 >> (this->BShiftR & 0x1f) | uVar6) >> 0x1b) +
                 (ulong)((uVar5 >> (this->GShiftR & 0x1f) | uVar5) >> 0x1b) * 0x20 +
                 (ulong)((uVar4 >> (this->RShiftR & 0x1f) | uVar4) >> 0x1b) * 0x400];
        }
        else {
          *_r = 0;
          *(ushort *)&(this->super_FTexture).field_0x31 =
               *(ushort *)&(this->super_FTexture).field_0x31 & 0xfff7 | 8;
        }
        _r = _r + (int)(uint)(this->super_FTexture).Height;
      }
      else {
        uVar4 = (g & this->RMask) << (this->RShiftL & 0x1f);
        uVar5 = (g & this->GMask) << (this->GShiftL & 0x1f);
        bVar1 = this->GShiftR;
        uVar6 = (g & this->BMask) << (this->BShiftL & 0x1f);
        bVar2 = this->BShiftR;
        uVar7 = (g & this->AMask) << (this->AShiftL & 0x1f);
        bVar3 = this->AShiftR;
        *_r = (byte)((uVar4 >> (this->RShiftR & 0x1f)) >> 0x18) | (byte)(uVar4 >> 0x18);
        _r[1] = (byte)((uVar5 >> (bVar1 & 0x1f)) >> 0x18) | (byte)(uVar5 >> 0x18);
        _r[2] = (byte)((uVar6 >> (bVar2 & 0x1f)) >> 0x18) | (byte)(uVar6 >> 0x18);
        _r[3] = (byte)((uVar7 >> (bVar3 & 0x1f)) >> 0x18) | (byte)(uVar7 >> 0x18);
        _r = _r + 4;
      }
    }
  }
  if (pBVar8 != (BYTE *)0x0) {
    operator_delete__(pBVar8);
  }
  return;
}

Assistant:

void FDDSTexture::ReadRGB (FWadLump &lump, BYTE *tcbuf)
{
	DWORD x, y;
	DWORD amask = AMask == 0 ? 0 : 0x80000000 >> AShiftL;
	BYTE *linebuff = new BYTE[Pitch];

	for (y = Height; y > 0; --y)
	{
		BYTE *buffp = linebuff;
		BYTE *pixelp = tcbuf? tcbuf + 4*y*Height : Pixels + y;
		lump.Read (linebuff, Pitch);
		for (x = Width; x > 0; --x)
		{
			DWORD c;
			if (Format == 4)
			{
				c = LittleLong(*(DWORD *)buffp); buffp += 4;
			}
			else if (Format == 2)
			{
				c = LittleShort(*(WORD *)buffp); buffp += 2;
			}
			else if (Format == 3)
			{
				c = buffp[0] | (buffp[1] << 8) | (buffp[2] << 16); buffp += 3;
			}
			else //  Format == 1
			{
				c = *buffp++;
			}
			if (!tcbuf)
			{
				if (amask == 0 || (c & amask))
				{
					DWORD r = (c & RMask) << RShiftL; r |= r >> RShiftR;
					DWORD g = (c & GMask) << GShiftL; g |= g >> GShiftR;
					DWORD b = (c & BMask) << BShiftL; b |= b >> BShiftR;
					*pixelp = RGB32k.RGB[r >> 27][g >> 27][b >> 27];
				}
				else
				{
					*pixelp = 0;
					bMasked = true;
				}
				pixelp += Height;
			}
			else
			{
				DWORD r = (c & RMask) << RShiftL; r |= r >> RShiftR;
				DWORD g = (c & GMask) << GShiftL; g |= g >> GShiftR;
				DWORD b = (c & BMask) << BShiftL; b |= b >> BShiftR;
				DWORD a = (c & AMask) << AShiftL; a |= a >> AShiftR;
				pixelp[0] = (BYTE)(r>>24);
				pixelp[1] = (BYTE)(g>>24);
				pixelp[2] = (BYTE)(b>>24);
				pixelp[3] = (BYTE)(a>>24);
				pixelp+=4;
			}
		}
	}
	delete[] linebuff;
}